

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelMappingSparse.h
# Opt level: O1

double __thiscall
ObservationModelMappingSparse::Get
          (ObservationModelMappingSparse *this,Index ja_i,Index suc_s_i,Index jo_i)

{
  sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  local_28;
  
  local_28.
  super_container_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  .c_ = (this->_m_O).
        super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[ja_i];
  local_28.i_ = (size_type)suc_s_i;
  local_28.j_ = (size_type)jo_i;
  boost::numeric::ublas::
  sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::get_d(&local_28);
  return local_28.d_;
}

Assistant:

double Get(Index ja_i, Index suc_s_i, Index jo_i) const
        { return((*_m_O[ja_i])(suc_s_i,jo_i)); }